

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallFileGenerator::SetImportLocationProperty
          (cmExportInstallFileGenerator *this,string *config,string *suffix,
          cmInstallTargetGenerator *itgen,ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations)

{
  string *__return_storage_ptr__;
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *target_00;
  cmGeneratorTarget *this_00;
  mapped_type *pmVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  string local_3a8;
  string local_388;
  string local_368;
  cmAlphaNum local_348;
  cmAlphaNum local_318;
  undefined1 local_2e8 [8];
  string prop_2;
  string_view local_2b8;
  string_view local_2a8;
  string local_298;
  cmAlphaNum local_278;
  cmAlphaNum local_248;
  string local_218;
  string *local_1f8;
  string *obj;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  cmAlphaNum local_190;
  undefined1 local_160 [8];
  string prop_1;
  string local_130;
  cmAlphaNum local_110;
  cmAlphaNum local_e0;
  undefined1 local_b0 [8];
  string prop;
  undefined1 local_80 [8];
  string value;
  string dest;
  cmGeneratorTarget *target;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *importedLocations_local;
  ImportPropertyMap *properties_local;
  cmInstallTargetGenerator *itgen_local;
  string *suffix_local;
  string *config_local;
  cmExportInstallFileGenerator *this_local;
  
  if ((itgen != (cmInstallTargetGenerator *)0x0) &&
     (bVar1 = cmInstallGenerator::InstallsForConfig(&itgen->super_cmInstallGenerator,config), bVar1)
     ) {
    target_00 = cmInstallTargetGenerator::GetTarget(itgen);
    __return_storage_ptr__ = (string *)((long)&value.field_2 + 8);
    cmInstallTargetGenerator::GetDestination(__return_storage_ptr__,itgen,config);
    std::__cxx11::string::string((string *)local_80);
    bVar1 = cmsys::SystemTools::FileIsFullPath(__return_storage_ptr__);
    if (!bVar1) {
      std::__cxx11::string::operator=((string *)local_80,"${_IMPORT_PREFIX}/");
    }
    std::__cxx11::string::operator+=((string *)local_80,(string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_80,"/");
    bVar1 = cmInstallTargetGenerator::IsImportLibrary(itgen);
    if (bVar1) {
      cmAlphaNum::cmAlphaNum(&local_e0,"IMPORTED_IMPLIB");
      cmAlphaNum::cmAlphaNum(&local_110,suffix);
      cmStrCat<>((string *)local_b0,&local_e0,&local_110);
      cmInstallTargetGenerator::GetInstallFilename(&local_130,target_00,config,NameImplib);
      std::__cxx11::string::operator+=((string *)local_80,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,(key_type *)local_b0);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_80);
      pVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(importedLocations,(value_type *)local_b0);
      prop_1.field_2._8_8_ = pVar4.first._M_node;
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      this_00 = cmInstallTargetGenerator::GetTarget(itgen);
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (TVar2 == OBJECT_LIBRARY) {
        cmAlphaNum::cmAlphaNum(&local_190,"IMPORTED_OBJECTS");
        cmAlphaNum::cmAlphaNum
                  ((cmAlphaNum *)
                   &objects.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,suffix);
        cmStrCat<>((string *)local_160,&local_190,
                   (cmAlphaNum *)
                   &objects.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3);
        cmInstallTargetGenerator::GetInstallObjectNames
                  (itgen,config,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3);
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3);
        obj = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range3);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&obj), bVar1) {
          local_1f8 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          cmAlphaNum::cmAlphaNum(&local_248,(string *)local_80);
          cmAlphaNum::cmAlphaNum(&local_278,local_1f8);
          cmStrCat<>(&local_218,&local_248,&local_278);
          std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_218);
          std::__cxx11::string::~string((string *)&local_218);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a8,";");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2b8);
        cmJoin(&local_298,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3,local_2a8,local_2b8);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,(key_type *)local_160);
        std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        pVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(importedLocations,(value_type *)local_160);
        prop_2.field_2._8_8_ = pVar4.first._M_node;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range3);
        std::__cxx11::string::~string((string *)local_160);
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_318,"IMPORTED_LOCATION");
        cmAlphaNum::cmAlphaNum(&local_348,suffix);
        cmStrCat<>((string *)local_2e8,&local_318,&local_348);
        bVar1 = cmGeneratorTarget::IsAppBundleOnApple(target_00);
        if (bVar1) {
          cmInstallTargetGenerator::GetInstallFilename(&local_368,target_00,config,NameNormal);
          std::__cxx11::string::operator+=((string *)local_80,(string *)&local_368);
          std::__cxx11::string::~string((string *)&local_368);
          std::__cxx11::string::operator+=((string *)local_80,".app/");
          bVar1 = cmMakefile::PlatformIsAppleEmbedded(target_00->Makefile);
          if (!bVar1) {
            std::__cxx11::string::operator+=((string *)local_80,"Contents/MacOS/");
          }
          cmInstallTargetGenerator::GetInstallFilename(&local_388,target_00,config,NameNormal);
          std::__cxx11::string::operator+=((string *)local_80,(string *)&local_388);
          std::__cxx11::string::~string((string *)&local_388);
        }
        else {
          cmInstallTargetGenerator::GetInstallFilename(&local_3a8,target_00,config,NameReal);
          std::__cxx11::string::operator+=((string *)local_80,(string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_3a8);
        }
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,(key_type *)local_2e8);
        std::__cxx11::string::operator=((string *)pmVar3,(string *)local_80);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(importedLocations,(value_type *)local_2e8);
        std::__cxx11::string::~string((string *)local_2e8);
      }
    }
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmInstallTargetGenerator* itgen, ImportPropertyMap& properties,
  std::set<std::string>& importedLocations)
{
  // Skip rules that do not match this configuration.
  if (!(itgen && itgen->InstallsForConfig(config))) {
    return;
  }

  // Get the target to be installed.
  cmGeneratorTarget* target = itgen->GetTarget();

  // Construct the installed location of the target.
  std::string dest = itgen->GetDestination(config);
  std::string value;
  if (!cmSystemTools::FileIsFullPath(dest)) {
    // The target is installed relative to the installation prefix.
    value = "${_IMPORT_PREFIX}/";
  }
  value += dest;
  value += "/";

  if (itgen->IsImportLibrary()) {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_IMPLIB", suffix);

    // Append the installed file name.
    value += cmInstallTargetGenerator::GetInstallFilename(
      target, config, cmInstallTargetGenerator::NameImplib);

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  } else if (itgen->GetTarget()->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_OBJECTS", suffix);

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<std::string> objects;
    itgen->GetInstallObjectNames(config, objects);
    for (std::string& obj : objects) {
      obj = cmStrCat(value, obj);
    }

    // Store the property.
    properties[prop] = cmJoin(objects, ";");
    importedLocations.insert(prop);
  } else {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_LOCATION", suffix);

    // Append the installed file name.
    if (target->IsAppBundleOnApple()) {
      value += cmInstallTargetGenerator::GetInstallFilename(target, config);
      value += ".app/";
      if (!target->Makefile->PlatformIsAppleEmbedded()) {
        value += "Contents/MacOS/";
      }
      value += cmInstallTargetGenerator::GetInstallFilename(target, config);
    } else {
      value += cmInstallTargetGenerator::GetInstallFilename(
        target, config, cmInstallTargetGenerator::NameReal);
    }

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  }
}